

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ReleaseTempRange(Parse *pParse,int iReg,int nReg)

{
  byte bVar1;
  int *piVar2;
  
  if (nReg == 1) {
    if (iReg == 0) {
      return;
    }
    bVar1 = pParse->nTempReg;
    if (7 < (ulong)bVar1) {
      return;
    }
    pParse->nTempReg = bVar1 + 1;
    piVar2 = pParse->aTempReg + bVar1;
  }
  else {
    if (nReg <= pParse->nRangeReg) {
      return;
    }
    pParse->nRangeReg = nReg;
    piVar2 = &pParse->iRangeReg;
  }
  *piVar2 = iReg;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ReleaseTempRange(Parse *pParse, int iReg, int nReg){
  if( nReg==1 ){
    sqlite3ReleaseTempReg(pParse, iReg);
    return;
  }
  if( nReg>pParse->nRangeReg ){
    pParse->nRangeReg = nReg;
    pParse->iRangeReg = iReg;
  }
}